

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

TrackDescriptor * __thiscall
perfetto::ProcessTrack::Serialize(TrackDescriptor *__return_storage_ptr__,ProcessTrack *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ProcessDescriptor *this_00;
  string cmdline;
  StringSplitter splitter;
  allocator<char> local_d9;
  string local_d8;
  StringSplitter local_b8;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Track::Serialize(__return_storage_ptr__,&this->super_Track);
  this_00 = protos::gen::TrackDescriptor::mutable_process(__return_storage_ptr__);
  protos::gen::ProcessDescriptor::set_pid(this_00,this->pid);
  paVar1 = &local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"/proc/self/cmdline",&local_d9);
  bVar2 = base::ReadFile(&local_b8.str_,&local_d8);
  ::std::__cxx11::string::~string((string *)&local_b8);
  if (bVar2) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,local_d8._M_dataplus._M_p,&local_d9);
    protos::gen::ProcessDescriptor::set_process_name(this_00,&local_b8.str_);
    ::std::__cxx11::string::~string((string *)&local_b8);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p == paVar1) {
      local_70.field_2._8_8_ = local_d8.field_2._8_8_;
    }
    else {
      local_70._M_dataplus._M_p = local_d8._M_dataplus._M_p;
    }
    local_70.field_2._M_allocated_capacity._1_7_ = local_d8.field_2._M_allocated_capacity._1_7_;
    local_70.field_2._M_local_buf[0] = local_d8.field_2._M_local_buf[0];
    local_70._M_string_length = local_d8._M_string_length;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_local_buf[0] = '\0';
    local_d8._M_dataplus._M_p = (pointer)paVar1;
    base::StringSplitter::StringSplitter(&local_b8,&local_70,'\0');
    ::std::__cxx11::string::~string((string *)&local_70);
    while( true ) {
      bVar2 = base::StringSplitter::Next(&local_b8);
      if (!bVar2) break;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,local_b8.cur_,local_b8.cur_ + local_b8.cur_size_);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this_00->cmdline_,&local_50);
      ::std::__cxx11::string::~string((string *)&local_50);
    }
    ::std::__cxx11::string::~string((string *)&local_b8);
  }
  ::std::__cxx11::string::~string((string *)&local_d8);
  return __return_storage_ptr__;
}

Assistant:

protos::gen::TrackDescriptor ProcessTrack::Serialize() const {
  auto desc = Track::Serialize();
  auto pd = desc.mutable_process();
  pd->set_pid(static_cast<int32_t>(pid));
#if PERFETTO_BUILDFLAG(PERFETTO_OS_LINUX) || \
    PERFETTO_BUILDFLAG(PERFETTO_OS_ANDROID)
  std::string cmdline;
  if (base::ReadFile("/proc/self/cmdline", &cmdline)) {
    // Since cmdline is a zero-terminated list of arguments, this ends up
    // writing just the first element, i.e., the process name, into the process
    // name field.
    pd->set_process_name(cmdline.c_str());
    base::StringSplitter splitter(std::move(cmdline), '\0');
    while (splitter.Next()) {
      pd->add_cmdline(
          std::string(splitter.cur_token(), splitter.cur_token_size()));
    }
  }
  // TODO(skyostil): Record command line on Windows and Mac.
#endif
  return desc;
}